

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::processFile(QPDF *this,char *filename,char *password)

{
  FileInputSource *this_00;
  shared_ptr<InputSource> local_48 [2];
  FileInputSource *local_28;
  FileInputSource *fi;
  char *password_local;
  char *filename_local;
  QPDF *this_local;
  
  fi = (FileInputSource *)password;
  password_local = filename;
  filename_local = (char *)this;
  this_00 = (FileInputSource *)operator_new(0xd8);
  FileInputSource::FileInputSource(this_00,password_local);
  local_28 = this_00;
  std::shared_ptr<InputSource>::shared_ptr<FileInputSource,void>(local_48,this_00);
  processInputSource(this,local_48,(char *)fi);
  std::shared_ptr<InputSource>::~shared_ptr(local_48);
  return;
}

Assistant:

void
QPDF::processFile(char const* filename, char const* password)
{
    auto* fi = new FileInputSource(filename);
    processInputSource(std::shared_ptr<InputSource>(fi), password);
}